

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O2

void __thiscall pg::Game::unsafe_permute(Game *this,int *mapping)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  ulong uVar4;
  uint64_t *puVar5;
  ulong uVar6;
  string **ppsVar7;
  string *psVar8;
  byte bVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  unsigned_long i;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  int i_2;
  reference local_68;
  reference local_58;
  ulong local_48;
  ulong local_40;
  int *local_38;
  
  uVar14 = this->n_vertices;
  piVar3 = this->strategy;
  for (uVar17 = 0; (~((long)uVar14 >> 0x3f) & uVar14) != uVar17; uVar17 = uVar17 + 1) {
    lVar15 = (long)piVar3[uVar17];
    if (lVar15 != -1) {
      piVar3[uVar17] = mapping[lVar15];
    }
  }
  piVar3 = this->_outedges;
  lVar15 = this->n_edges + uVar14;
  for (lVar18 = 0; lVar15 != lVar18; lVar18 = lVar18 + 1) {
    lVar16 = (long)piVar3[lVar18];
    if (lVar16 != -1) {
      piVar3[lVar18] = mapping[lVar16];
    }
  }
  piVar3 = this->_inedges;
  if (piVar3 != (int *)0x0) {
    for (lVar18 = 0; lVar15 != lVar18; lVar18 = lVar18 + 1) {
      if ((long)piVar3[lVar18] != -1) {
        piVar3[lVar18] = mapping[piVar3[lVar18]];
      }
    }
  }
  local_38 = mapping;
  for (uVar17 = 0; (long)uVar17 < (long)uVar14; uVar17 = uVar17 + 1) {
    uVar14 = uVar17 >> 6;
    local_40 = 1L << (uVar17 & 0x3f);
    bVar9 = (byte)uVar17 & 0x3f;
    local_48 = -2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9;
    while (uVar10 = local_40, uVar1 = mapping[uVar17], uVar17 != uVar1) {
      uVar13 = (ulong)(int)uVar1;
      uVar19 = uVar13 >> 6;
      mapping[uVar17] = mapping[uVar13];
      mapping[uVar13] = uVar1;
      piVar3 = this->_priority;
      iVar2 = piVar3[uVar17];
      piVar3[uVar17] = piVar3[uVar13];
      piVar3[uVar13] = iVar2;
      local_58._block = (this->_owner)._bits;
      local_68._block = local_58._block + uVar19;
      uVar4 = *local_68._block;
      local_58._block = local_58._block + uVar14;
      uVar20 = 1L << (uVar13 & 0x3f);
      local_58._mask = local_40;
      local_68._mask = uVar20;
      bitset::reference::operator=(&local_68,&local_58);
      uVar12 = local_40;
      puVar5 = (this->_owner)._bits;
      uVar6 = puVar5[uVar14];
      uVar10 = uVar6 | uVar10;
      if ((uVar4 >> (uVar13 & 0x3f) & 1) == 0) {
        uVar10 = uVar6 & local_48;
      }
      puVar5[uVar14] = uVar10;
      ppsVar7 = this->_label;
      psVar8 = ppsVar7[uVar17];
      ppsVar7[uVar17] = ppsVar7[uVar13];
      ppsVar7[uVar13] = psVar8;
      piVar3 = this->_firstouts;
      iVar2 = piVar3[uVar17];
      piVar3[uVar17] = piVar3[uVar13];
      piVar3[uVar13] = iVar2;
      piVar3 = this->_outcount;
      iVar2 = piVar3[uVar17];
      piVar3[uVar17] = piVar3[uVar13];
      piVar3[uVar13] = iVar2;
      if (this->_inedges != (int *)0x0) {
        piVar3 = this->_firstins;
        iVar2 = piVar3[uVar17];
        piVar3[uVar17] = piVar3[uVar13];
        piVar3[uVar13] = iVar2;
        piVar3 = this->_incount;
        iVar2 = piVar3[uVar17];
        piVar3[uVar17] = piVar3[uVar13];
        piVar3[uVar13] = iVar2;
      }
      local_58._block = (this->solved)._bits;
      local_68._block = local_58._block + uVar19;
      local_58._block = local_58._block + uVar14;
      uVar10 = *local_68._block;
      local_58._mask = local_40;
      local_68._mask = uVar20;
      bitset::reference::operator=(&local_68,&local_58);
      uVar6 = local_48;
      puVar5 = (this->solved)._bits;
      uVar4 = puVar5[uVar14];
      uVar11 = uVar4 | uVar12;
      if ((uVar10 & uVar20) == 0) {
        uVar11 = uVar4 & local_48;
      }
      puVar5[uVar14] = uVar11;
      local_58._block = (this->winner)._bits;
      local_68._block = local_58._block + uVar19;
      local_58._block = local_58._block + uVar14;
      uVar10 = *local_68._block;
      local_58._mask = uVar12;
      local_68._mask = uVar20;
      bitset::reference::operator=(&local_68,&local_58);
      puVar5 = (this->winner)._bits;
      uVar4 = puVar5[uVar14];
      uVar12 = uVar4 | uVar12;
      if ((uVar10 & uVar20) == 0) {
        uVar12 = uVar4 & uVar6;
      }
      puVar5[uVar14] = uVar12;
      piVar3 = this->strategy;
      iVar2 = piVar3[uVar17];
      piVar3[uVar17] = piVar3[uVar13];
      piVar3[uVar13] = iVar2;
      mapping = local_38;
    }
    uVar14 = this->n_vertices;
  }
  return;
}

Assistant:

void
Game::unsafe_permute(int *mapping)
{
    // first update vectors and arrays and the strategies
    for (int i=0; i<n_vertices; i++) {
        if (strategy[i] != -1) strategy[i] = mapping[strategy[i]];
    }
    unsigned long len = n_vertices + n_edges;
    for (unsigned long i=0; i<len; i++) {
        if (_outedges[i] != -1) _outedges[i] = mapping[_outedges[i]];
    }
    if (_inedges != NULL) {
        for (unsigned long i=0; i<len; i++) {
            if (_inedges[i] != -1) _inedges[i] = mapping[_inedges[i]];
        }
    }
    // swap nodes until done
    for (int i=0; i<n_vertices; i++) {
        // this is basically a loop, that swaps mapping[i] and i, until mapping[i] equals i.
        while (mapping[i] != i) {
            int k = mapping[i];
            mapping[i] = mapping[k];
            mapping[k] = k;
            // swap i and k
            std::swap(_priority[i], _priority[k]);
            { bool b = _owner[k]; _owner[k] = _owner[i]; _owner[i] = b; }
            std::swap(_label[i], _label[k]);
            // swap out array
            std::swap(_firstouts[i], _firstouts[k]);
            std::swap(_outcount[i], _outcount[k]);
            // swap in array
            if (_inedges != NULL) {
                std::swap(_firstins[i], _firstins[k]);
                std::swap(_incount[i], _incount[k]);
            }
            // swap solution
            { bool b = solved[k]; solved[k] = solved[i]; solved[i] = b; }
            { bool b = winner[k]; winner[k] = winner[i]; winner[i] = b; }
            std::swap(strategy[i], strategy[k]);
        }
    }
}